

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::checkImageFormatRequirements
               (InstanceInterface *vki,VkPhysicalDevice physDevice,VkSampleCountFlagBits sampleCount
               ,VkFormat format,VkImageUsageFlags usage)

{
  int iVar1;
  NotSupportedError *this;
  VkImageFormatProperties imageFormatProperties;
  VkPhysicalDeviceFeatures features;
  
  (*vki->_vptr_InstanceInterface[2])(vki,physDevice,&features);
  if (((usage & 8) == 0) || (features.shaderStorageImageMultisample != 0)) {
    iVar1 = (*vki->_vptr_InstanceInterface[4])
                      (vki,physDevice,(ulong)format,1,0,usage,0,&imageFormatProperties);
    if (iVar1 == -0xb) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"Image format is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                 ,0x208);
    }
    else {
      if ((sampleCount & ~imageFormatProperties.sampleCounts) == 0) {
        return;
      }
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"Requested sample count is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                 ,0x20b);
    }
  }
  else {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Multisampled storage images are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
               ,0x201);
  }
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkImageFormatRequirements (const InstanceInterface&		vki,
								   const VkPhysicalDevice		physDevice,
								   const VkSampleCountFlagBits	sampleCount,
								   const VkFormat				format,
								   const VkImageUsageFlags		usage)
{
	VkPhysicalDeviceFeatures	features;
	vki.getPhysicalDeviceFeatures(physDevice, &features);

	if (((usage & VK_IMAGE_USAGE_STORAGE_BIT) != 0) && !features.shaderStorageImageMultisample)
		TCU_THROW(NotSupportedError, "Multisampled storage images are not supported");

	VkImageFormatProperties		imageFormatProperties;
	const VkResult				imageFormatResult		= vki.getPhysicalDeviceImageFormatProperties(
		physDevice, format, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_OPTIMAL, usage, (VkImageCreateFlags)0, &imageFormatProperties);

	if (imageFormatResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
		TCU_THROW(NotSupportedError, "Image format is not supported");

	if ((imageFormatProperties.sampleCounts & sampleCount) != sampleCount)
		TCU_THROW(NotSupportedError, "Requested sample count is not supported");
}